

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  HashGenerator *this;
  HashGenerator *this_00;
  char *pcVar1;
  
  this = (HashGenerator *)operator_new(8);
  SumHashGenerator::SumHashGenerator((SumHashGenerator *)this);
  this_00 = (HashGenerator *)operator_new(8);
  ToUpperHashGenerator::ToUpperHashGenerator((ToUpperHashGenerator *)this_00);
  printf("ori str: %s\n","abcde");
  pcVar1 = HashGenerator::genHash(this,"abcde");
  printf("sum hash for %s is: %s\n","abcde",pcVar1);
  pcVar1 = HashGenerator::genHash(this_00,"abcde");
  printf("to-upper hash for %s is: %s\n","abcde",pcVar1);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	const char* str = "abcde";
	HashGenerator *gen1 = new SumHashGenerator();
	HashGenerator *gen2 = new ToUpperHashGenerator();

	printf("ori str: %s\n", str);
	printf("sum hash for %s is: %s\n", str, gen1->genHash(str));
	printf("to-upper hash for %s is: %s\n", str, gen2->genHash(str));

	return 0;
}